

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::Detail::parseEnums
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          StringRef enums)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_type extraout_RDX;
  size_type sVar4;
  size_type extraout_RDX_00;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  char *pcVar5;
  Catch *this;
  char in_R8B;
  StringRef *enumValue;
  pointer pSVar6;
  StringRef ref;
  StringRef str;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> enumValues;
  StringRef local_40;
  
  str.m_start = (char *)enums.m_size;
  str.m_size = 0x2c;
  splitStringRef(&enumValues,(Catch *)enums.m_start,str,in_R8B);
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::reserve
            (__return_storage_ptr__,
             (long)enumValues.
                   super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)enumValues.
                   super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  sVar4 = extraout_RDX;
  pSVar6 = enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pSVar6 == enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      clara::std::_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~_Vector_base
                (&enumValues.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                );
      return __return_storage_ptr__;
    }
    uVar1 = pSVar6->m_size;
    uVar2 = uVar1;
    do {
      uVar3 = uVar2;
      if (uVar3 == 0) break;
      uVar2 = uVar3 - 1;
    } while (pSVar6->m_start[uVar3 - 1] != ':');
    this = (Catch *)(pSVar6->m_start + uVar3);
    pcVar5 = (char *)(uVar1 - uVar3);
    if (uVar1 < uVar3) {
      pcVar5 = (char *)0x0;
    }
    if (uVar1 < uVar3 || (char *)(uVar1 - uVar3) == (char *)0x0) {
      this = (Catch *)0x15ce6b;
    }
    ref.m_size = sVar4;
    ref.m_start = pcVar5;
    local_40 = trim(this,ref);
    clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
    emplace_back<Catch::StringRef>(__return_storage_ptr__,&local_40);
    pSVar6 = pSVar6 + 1;
    sVar4 = extraout_RDX_00;
  } while( true );
}

Assistant:

std::vector<StringRef> parseEnums( StringRef enums ) {
            auto enumValues = splitStringRef( enums, ',' );
            std::vector<StringRef> parsed;
            parsed.reserve( enumValues.size() );
            for( auto const& enumValue : enumValues ) {
                parsed.push_back(trim(extractInstanceName(enumValue)));
            }
            return parsed;
        }